

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::FieldMaskUtil::SnakeCaseToCamelCase
          (FieldMaskUtil *this,StringPiece input,string *output)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  long i;
  undefined1 local_38 [8];
  StringPiece input_local;
  
  input_local.ptr_ = input.ptr_;
  ((undefined8 *)input.length_)[1] = 0;
  **(undefined1 **)input.length_ = 0;
  if ((long)input_local.ptr_ < 1) {
    bVar3 = true;
  }
  else {
    i = 0;
    bVar3 = false;
    local_38 = (undefined1  [8])this;
    do {
      cVar2 = StringPiece::operator[]((StringPiece *)local_38,i);
      if (('@' < cVar2) && (cVar2 = StringPiece::operator[]((StringPiece *)local_38,i), cVar2 < '[')
         ) {
        return false;
      }
      cVar2 = StringPiece::operator[]((StringPiece *)local_38,i);
      if (bVar3) {
        if (cVar2 < 'a') {
          return false;
        }
        cVar2 = StringPiece::operator[]((StringPiece *)local_38,i);
        if ('z' < cVar2) {
          return false;
        }
        StringPiece::operator[]((StringPiece *)local_38,i);
        bVar3 = false;
LAB_0030a618:
        std::__cxx11::string::push_back((char)input.length_);
        bVar1 = bVar3;
      }
      else {
        bVar1 = true;
        if (cVar2 != '_') {
          StringPiece::operator[]((StringPiece *)local_38,i);
          goto LAB_0030a618;
        }
      }
      bVar3 = bVar1;
      i = i + 1;
    } while (i < (long)input_local.ptr_);
    bVar3 = (bool)(bVar3 ^ 1);
  }
  return bVar3;
}

Assistant:

bool FieldMaskUtil::SnakeCaseToCamelCase(StringPiece input,
                                         std::string* output) {
  output->clear();
  bool after_underscore = false;
  for (int i = 0; i < input.size(); ++i) {
    if (input[i] >= 'A' && input[i] <= 'Z') {
      // The field name must not contain uppercase letters.
      return false;
    }
    if (after_underscore) {
      if (input[i] >= 'a' && input[i] <= 'z') {
        output->push_back(input[i] + 'A' - 'a');
        after_underscore = false;
      } else {
        // The character after a "_" must be a lowercase letter.
        return false;
      }
    } else if (input[i] == '_') {
      after_underscore = true;
    } else {
      output->push_back(input[i]);
    }
  }
  if (after_underscore) {
    // Trailing "_".
    return false;
  }
  return true;
}